

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O1

void rnndec_freecontext(rnndeccontext *ctx)

{
  long lVar1;
  
  if (0 < ctx->varsnum) {
    lVar1 = 0;
    do {
      free(ctx->vars[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < ctx->varsnum);
  }
  free(ctx->vars);
  free(ctx);
  return;
}

Assistant:

void rnndec_freecontext(struct rnndeccontext *ctx) {
	int i;
	for (i = 0; i < ctx->varsnum; ++i)
		free(ctx->vars[i]);
	free(ctx->vars);
	free(ctx);
}